

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O3

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,AbstractTxIn *actual)

{
  pointer *ppuVar1;
  _Alloc_hider lhs;
  undefined8 lhs_00;
  bool bVar2;
  undefined4 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertHelper local_e8;
  void *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [56];
  Script local_90;
  undefined **local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [3];
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  cfd::core::Txid::GetHex_abi_cxx11_();
  lhs_00 = local_c8._0_8_;
  cfd::core::AbstractTxIn::GetTxid();
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_58,"expect_txid.GetHex().c_str()",
             "actual.GetTxid().GetHex().c_str()",(char *)lhs_00,
             (char *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_));
  ppuVar1 = (pointer *)
            ((long)&local_90.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  if ((pointer *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) != ppuVar1) {
    operator_delete((undefined1 *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_))
    ;
  }
  local_e8.data_ = (AssertHelperData *)&PTR__Txid_004ccb78;
  if (local_e0 != (void *)0x0) {
    operator_delete(local_e0);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10))
  {
    operator_delete((void *)local_c8._0_8_);
  }
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_50[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_50[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x20,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._vptr_Script._0_4_ = cfd::core::AbstractTxIn::GetVout();
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"expect_index","actual.GetVout()",&expect_index,(uint *)&local_90)
  ;
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((pointer)local_c8._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar4 = (char *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_);
  cfd::core::AbstractTxIn::GetOutPoint();
  cfd::core::OutPoint::GetTxid();
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_38,"expect_txid.GetHex().c_str()",
             "actual.GetOutPoint().GetTxid().GetHex().c_str()",pcVar4,(char *)local_e8.data_);
  if (local_e8.data_ != (AssertHelperData *)local_d8) {
    operator_delete(local_e8.data_);
  }
  local_58 = &PTR__Txid_004ccb78;
  if (local_50[0].ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(local_50[0].ptr_);
  }
  local_c8._0_8_ = &PTR__Txid_004ccb78;
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_);
  }
  if ((pointer *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) != ppuVar1) {
    operator_delete((undefined1 *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_))
    ;
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x23,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetOutPoint();
  uVar3 = cfd::core::OutPoint::GetVout();
  local_e8.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_90,"expect_index","actual.GetOutPoint().GetVout()",&expect_index,
             (uint *)&local_e8);
  local_c8._0_8_ = &PTR__Txid_004ccb78;
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_);
  }
  if ((char)local_90._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_c8);
    if (local_90.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_90.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x24,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._vptr_Script._0_4_ = cfd::core::AbstractTxIn::GetSequence();
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"expect_sequence","actual.GetSequence()",&expect_sequence,
             (uint *)&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((pointer)local_c8._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x25,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_90._vptr_Script._4_4_,local_90._vptr_Script._0_4_) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lhs = expect_script_hex_abi_cxx11_._M_dataplus;
  cfd::core::AbstractTxIn::GetUnlockingScript();
  cfd::core::Script::GetScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_58,"expect_script_hex.c_str()",
             "actual.GetUnlockingScript().GetScript().GetHex().c_str()",lhs._M_p,
             (char *)local_e8.data_);
  if (local_e8.data_ != (AssertHelperData *)local_d8) {
    operator_delete(local_e8.data_);
  }
  cfd::core::Script::~Script((Script *)local_c8);
  cfd::core::Script::~Script(&local_90);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_50[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_50[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}